

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void __thiscall Fl_Widget::tooltip(Fl_Widget *this,char *text)

{
  uint uVar1;
  char *text_local;
  Fl_Widget *this_local;
  
  Fl_Tooltip::set_enter_exit_once_();
  uVar1 = flags(this);
  if ((uVar1 & 0x20000) != 0) {
    if (this->tooltip_ == text) {
      return;
    }
    free(this->tooltip_);
    clear_flag(this,0x20000);
  }
  this->tooltip_ = text;
  return;
}

Assistant:

void Fl_Widget::tooltip(const char *text) {
  Fl_Tooltip::set_enter_exit_once_();
  if (flags() & COPIED_TOOLTIP) {
    // reassigning a copied tooltip remains the same copied tooltip
    if (tooltip_ == text) return;
    free((void*)(tooltip_));            // free maintained copy
    clear_flag(COPIED_TOOLTIP);         // disable copy flag (WE don't make copies)
  }
  tooltip_ = text;
}